

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O3

void __thiscall AstWalker::visitIfStatementAstNode(AstWalker *this,IfStatementAstNode *node)

{
  (*this->_vptr_AstWalker[0x16])();
  (*this->_vptr_AstWalker[3])
            (this,(node->expression).
                  super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (*this->_vptr_AstWalker[2])
            (this,(node->ifStatement).
                  super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((node->elseStatement).super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
      _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged == true) {
    (*this->_vptr_AstWalker[2])
              (this,(node->elseStatement).
                    super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload
                    .super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                    _M_value.super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  (*this->_vptr_AstWalker[0x25])(this,node);
  return;
}

Assistant:

void AstWalker::visitIfStatementAstNode(IfStatementAstNode* node) noexcept {
  this->onEnterIfStatementAstNode(node);
  this->visitExpressionAstNode(node->expression.get());
  this->visitStatementAstNode(node->ifStatement.get());
  if (node->elseStatement) {
    this->visitStatementAstNode(node->elseStatement->get());
  }
  this->onExitIfStatementAstNode(node);
}